

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.hpp
# Opt level: O2

tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_> *
__thiscall
njoy::ENDFtk::record::Zipper::
unzip<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Real,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,Zipper *this,uint64_t nEntries,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  ulong uVar2;
  int iVar3;
  tuple<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  ulong local_38;
  
  pvVar1 = &(__return_storage_ptr__->
            super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
            ).super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>,_false>.
            _M_head_impl;
  (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           ).super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
           super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
    ).super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
    super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data =
       (undefined1  [16])0x0;
  reserve<std::tuple<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>,1ul>
            (this,__return_storage_ptr__);
  local_48.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  ._M_head_impl._M_current =
       *(_Head_base<1UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
         *)&(__return_storage_ptr__->
            super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
            ).super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
            super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data;
  local_48.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  ._M_head_impl._M_current =
       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__return_storage_ptr__->
       super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
       ).super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (ulong)this / 3;
  local_38 = (ulong)this % 3;
  while (iVar3 = (int)uVar2, uVar2 = (ulong)(iVar3 - 1), iVar3 != 0) {
    readLine<njoy::ENDFtk::record::Zipper::Zipped<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Real>,std::tuple<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&local_48,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)nEntries,it,(long *)end,(int)lineNumber,MAT,MF);
    local_48.
    super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
    .
    super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
    .
    super__Head_base<1UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
    ._M_head_impl._M_current =
         (_Head_base<1UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
          )((long)local_48.
                  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                  .
                  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                  .
                  super__Head_base<1UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                  ._M_head_impl._M_current + 0x18);
    local_48.
    super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
    .
    super__Head_base<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
    ._M_head_impl._M_current =
         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
         ((long)local_48.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current + 0x18);
  }
  if (local_38 != 0) {
    readPartialLine<njoy::ENDFtk::record::Zipper::Zipped<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Real>,std::tuple<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,0ul,1ul>
              (local_38,&local_48,nEntries,it,end,(ulong)lineNumber & 0xffffffff,MAT,MF);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::tuple< std::vector< typename ENDFTypes::Type >... >
unzip
( uint64_t nEntries,
  Iterator& it, const Iterator& end, long& lineNumber,
  int MAT, int MF, int MT ){
    
  std::tuple< std::vector< typename ENDFTypes::Type >... > result;    
  reserve( nEntries, result );

  using Zip = Zipped< ENDFTypes... >;
  auto iterators = makeIteratorTuple( result, Zip::tupleIndices );

  int remainingLines = nEntries / Zip::tuplesPerRecord;
  while ( remainingLines-- ){
    readLine< Zip >( iterators, it, end, lineNumber, MAT, MF, MT );
    increment< Zip >( iterators );
  }
    
  const int remainingEntries = nEntries % Zip::tuplesPerRecord;
  if ( remainingEntries ){
    readPartialLine< Zip >
      ( remainingEntries, iterators, it, end, lineNumber,
        MAT, MF, MT, Zip::tupleIndices );
  }
    
  return result;
}